

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_copy_tile_quantization_parameters(opj_j2k_v2_t *p_j2k)

{
  long lVar1;
  long lVar2;
  long in_RDI;
  OPJ_UINT32 l_size;
  opj_tccp_t *l_copied_tccp;
  opj_tccp_t *l_ref_tccp;
  opj_tcp_v2_t *l_tcp;
  opj_cp_v2_t *l_cp;
  OPJ_UINT32 i;
  undefined8 local_40;
  undefined8 local_30;
  undefined4 local_c;
  
  if (*(int *)(in_RDI + 8) == 0x10) {
    local_40 = *(long *)(in_RDI + 0xd0) + (ulong)*(uint *)(in_RDI + 0x118) * 0x1630;
  }
  else {
    local_40 = *(long *)(in_RDI + 0x10);
  }
  lVar1 = *(long *)(local_40 + 0x15d0);
  lVar2 = lVar1;
  for (local_c = 1; local_30 = lVar2 + 0x438, local_c < *(uint *)(*(long *)(in_RDI + 0x60) + 0x10);
      local_c = local_c + 1) {
    *(undefined4 *)(lVar2 + 0x450) = *(undefined4 *)(lVar1 + 0x18);
    *(undefined4 *)(lVar2 + 0x75c) = *(undefined4 *)(lVar1 + 0x324);
    memcpy((void *)(lVar2 + 0x454),(void *)(lVar1 + 0x1c),0x308);
    lVar2 = local_30;
  }
  return;
}

Assistant:

void j2k_copy_tile_quantization_parameters( opj_j2k_v2_t *p_j2k )
{
	OPJ_UINT32 i;
	opj_cp_v2_t *l_cp = NULL;
	opj_tcp_v2_t *l_tcp = NULL;
	opj_tccp_t *l_ref_tccp = NULL;
	opj_tccp_t *l_copied_tccp = NULL;
	OPJ_UINT32 l_size;

	/* preconditions */
	assert(p_j2k != 00);

	l_cp = &(p_j2k->m_cp);
	l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
			&l_cp->tcps[p_j2k->m_current_tile_number] :
			p_j2k->m_specific_param.m_decoder.m_default_tcp;

	l_ref_tccp = &l_tcp->tccps[0];
	l_copied_tccp = l_ref_tccp + 1;
	l_size = J2K_MAXBANDS * sizeof(opj_stepsize_t);

	for	(i=1;i<p_j2k->m_private_image->numcomps;++i) {
		l_copied_tccp->qntsty = l_ref_tccp->qntsty;
		l_copied_tccp->numgbits = l_ref_tccp->numgbits;
		memcpy(l_copied_tccp->stepsizes,l_ref_tccp->stepsizes,l_size);
		++l_copied_tccp;
	}
}